

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O0

base_learner * cb_adf_setup(options_i *options,vw *all)

{
  parser *ppVar1;
  undefined *puVar2;
  undefined *puVar3;
  undefined *puVar4;
  undefined *puVar5;
  undefined *puVar6;
  undefined *puVar7;
  undefined *puVar8;
  undefined8 uVar9;
  byte bVar10;
  int iVar11;
  pointer pcVar12;
  ostream *this;
  base_learner *base_00;
  learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_> *this_00;
  id in_RSI;
  long *in_RDI;
  learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_> *l;
  cb_adf *bare;
  multi_learner *base;
  bool check_baseline_enabled;
  size_t problem_multiplier;
  option_group_definition new_options;
  string type_string;
  bool cb_adf_option;
  free_ptr<CB_ADF::cb_adf> ld;
  string *in_stack_fffffffffffff748;
  prediction_type_t pred_type;
  vw *in_stack_fffffffffffff750;
  string *in_stack_fffffffffffff758;
  multi_learner *in_stack_fffffffffffff760;
  allocator *in_stack_fffffffffffff770;
  byte local_872;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff798;
  allocator *paVar13;
  option_group_definition *in_stack_fffffffffffff7a0;
  byte local_7e2;
  allocator *l_00;
  allocator local_6c1;
  string local_6c0 [39];
  allocator local_699;
  string local_698 [39];
  allocator local_671;
  string local_670 [39];
  allocator local_649;
  string local_648 [39];
  allocator local_621;
  string local_620 [39];
  allocator local_5f9;
  string local_5f8 [39];
  allocator local_5d1;
  string local_5d0 [39];
  allocator local_5a9;
  string local_5a8 [39];
  allocator local_581;
  string local_580 [37];
  byte local_55b;
  byte local_55a;
  allocator local_559;
  string local_558 [37];
  byte local_533;
  byte local_532;
  allocator local_531;
  string local_530 [39];
  allocator local_509;
  string local_508 [39];
  byte local_4e1;
  undefined8 local_4e0;
  allocator local_4d1;
  string local_4d0 [39];
  allocator local_4a9;
  string local_4a8 [32];
  undefined4 local_488;
  allocator local_481;
  string local_480 [39];
  allocator local_459;
  string local_458 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_438;
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [199];
  allocator local_2a1;
  string local_2a0 [39];
  allocator local_279;
  string local_278 [32];
  typed_option<bool> local_258;
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [32];
  typed_option<bool> local_168;
  allocator local_c1;
  string local_c0 [32];
  undefined1 local_a0 [79];
  allocator local_51;
  string local_50 [39];
  byte local_29;
  undefined1 local_28 [32];
  AllReduce *local_8;
  
  local_28._16_8_ = in_RSI._M_thread;
  local_28._24_8_ = in_RDI;
  scoped_calloc_or_throw<CB_ADF::cb_adf>();
  local_29 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"mtr",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  l_00 = &local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"Contextual Bandit with Action Dependent Features",l_00);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"cb_adf",&local_189);
  VW::config::make_option<bool>(in_stack_fffffffffffff758,(bool *)in_stack_fffffffffffff750);
  VW::config::typed_option<bool>::keep(&local_168,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1b0,"Do Contextual Bandit learning with multiline action dependent features.",
             &local_1b1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff7a0,(typed_option<bool> *)in_stack_fffffffffffff798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"rank_all",&local_279);
  std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)0x3a730f);
  VW::config::make_option<bool>(in_stack_fffffffffffff758,(bool *)in_stack_fffffffffffff750);
  VW::config::typed_option<bool>::keep(&local_258,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"Return actions sorted by score order",&local_2a1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff7a0,(typed_option<bool> *)in_stack_fffffffffffff798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"no_predict",&local_369);
  std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)0x3a73fd);
  VW::config::make_option<bool>(in_stack_fffffffffffff758,(bool *)in_stack_fffffffffffff750);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"Do not do a prediction when training",&local_391);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff7a0,(typed_option<bool> *)in_stack_fffffffffffff798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"cb_type",&local_459);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff758,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff750);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(&local_438,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_480,"contextual bandit method to use in {ips, dm, dr, mtr, sm}. Default: mtr",
             &local_481);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  pred_type = (prediction_type_t)((ulong)in_stack_fffffffffffff748 >> 0x20);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff750);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff750);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff750);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff750);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  (*(code *)**(undefined8 **)local_28._24_8_)(local_28._24_8_,local_a0);
  uVar9 = local_28._24_8_;
  if ((local_29 & 1) == 0) {
    local_8 = (AllReduce *)0x0;
    goto LAB_003a88f4;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a8,"cb_type",&local_4a9);
  bVar10 = (**(code **)(*(long *)uVar9 + 8))(uVar9,local_4a8);
  std::__cxx11::string::~string(local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  uVar9 = local_28._24_8_;
  if (((bVar10 ^ 0xff) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4d0,"cb_type",&local_4d1);
    (**(code **)(*(long *)uVar9 + 0x28))(uVar9,local_4d0,local_50);
    std::__cxx11::string::~string(local_4d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
    (*(code *)**(undefined8 **)local_28._24_8_)(local_28._24_8_,local_a0);
  }
  uVar9 = local_28._16_8_;
  pcVar12 = std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::operator->
                      ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)0x3a7bf9);
  pcVar12->all = (vw *)uVar9;
  local_4e0 = 1;
  local_4e1 = 0;
  iVar11 = std::__cxx11::string::compare((char *)local_50);
  if (iVar11 == 0) {
    pcVar12 = std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::operator->
                        ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)0x3a7c3e);
    (pcVar12->gen_cs).cb_type = 0;
    local_4e0 = 2;
    local_4e1 = 1;
  }
  else {
    iVar11 = std::__cxx11::string::compare((char *)local_50);
    if (iVar11 == 0) {
      pcVar12 = std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::operator->
                          ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)0x3a7c85);
      (pcVar12->gen_cs).cb_type = 2;
    }
    else {
      iVar11 = std::__cxx11::string::compare((char *)local_50);
      if (iVar11 == 0) {
        pcVar12 = std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::operator->
                            ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)0x3a7cb8);
        (pcVar12->gen_cs).cb_type = 3;
      }
      else {
        iVar11 = std::__cxx11::string::compare((char *)local_50);
        if (iVar11 == 0) {
          pcVar12 = std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::operator->
                              ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)0x3a7ceb);
          (pcVar12->gen_cs).cb_type = 1;
        }
        else {
          iVar11 = std::__cxx11::string::compare((char *)local_50);
          if (iVar11 == 0) {
            pcVar12 = std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::operator->
                                ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)0x3a7d1e);
            (pcVar12->gen_cs).cb_type = 4;
          }
          else {
            this = std::operator<<((ostream *)(local_28._16_8_ + 0xe0),
                                   "warning: cb_type must be in {\'ips\',\'dr\',\'mtr\',\'dm\',\'sm\'}; resetting to mtr."
                                  );
            std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
            pcVar12 = std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::operator->
                                ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)0x3a7d70);
            (pcVar12->gen_cs).cb_type = 3;
          }
        }
      }
    }
  }
  uVar9 = local_28._24_8_;
  *(code **)(local_28._16_8_ + 0x3430) = ACTION_SCORE::delete_action_scores;
  std::allocator<char>::allocator();
  local_532 = 0;
  local_533 = 0;
  local_55a = 0;
  local_55b = 0;
  std::__cxx11::string::string(local_508,"csoaa_ldf",&local_509);
  bVar10 = (**(code **)(*(long *)uVar9 + 8))(uVar9,local_508);
  uVar9 = local_28._24_8_;
  if ((bVar10 & 1) == 0) {
    std::allocator<char>::allocator();
    local_532 = 1;
    std::__cxx11::string::string(local_530,"wap_ldf",&local_531);
    local_533 = 1;
    bVar10 = (**(code **)(*(long *)uVar9 + 8))(uVar9,local_530);
    local_7e2 = 1;
    if ((bVar10 & 1) != 0) goto LAB_003a7ebb;
  }
  else {
LAB_003a7ebb:
    pcVar12 = std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::operator->
                        ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)0x3a7ec8);
    uVar9 = local_28._24_8_;
    local_7e2 = 1;
    if ((pcVar12->rank_all & 1U) == 0) {
      std::allocator<char>::allocator();
      local_55a = 1;
      std::__cxx11::string::string(local_558,"csoaa_rank",&local_559);
      local_55b = 1;
      local_7e2 = (**(code **)(*(long *)uVar9 + 8))(uVar9,local_558);
      local_7e2 = local_7e2 ^ 0xff;
    }
  }
  if ((local_55b & 1) != 0) {
    std::__cxx11::string::~string(local_558);
  }
  if ((local_55a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_559);
  }
  if ((local_533 & 1) != 0) {
    std::__cxx11::string::~string(local_530);
  }
  if ((local_532 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_531);
  }
  std::__cxx11::string::~string(local_508);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  uVar9 = local_28._24_8_;
  if ((local_7e2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_580,"csoaa_ldf",&local_581);
    bVar10 = (**(code **)(*(long *)uVar9 + 8))(uVar9,local_580);
    std::__cxx11::string::~string(local_580);
    std::allocator<char>::~allocator((allocator<char> *)&local_581);
    uVar9 = local_28._24_8_;
    if (((bVar10 ^ 0xff) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5a8,"csoaa_ldf",&local_5a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5d0,"multiline",&local_5d1);
      (**(code **)(*(long *)uVar9 + 0x28))(uVar9,local_5a8,local_5d0);
      std::__cxx11::string::~string(local_5d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
      std::__cxx11::string::~string(local_5a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
    }
    uVar9 = local_28._24_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5f8,"csoaa_rank",&local_5f9);
    bVar10 = (**(code **)(*(long *)uVar9 + 8))(uVar9,local_5f8);
    std::__cxx11::string::~string(local_5f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
    uVar9 = local_28._24_8_;
    if (((bVar10 ^ 0xff) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_620,"csoaa_rank",&local_621);
      paVar13 = &local_649;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_648,"",paVar13);
      (**(code **)(*(long *)uVar9 + 0x28))(uVar9,local_620,local_648);
      std::__cxx11::string::~string(local_648);
      std::allocator<char>::~allocator((allocator<char> *)&local_649);
      std::__cxx11::string::~string(local_620);
      std::allocator<char>::~allocator((allocator<char> *)&local_621);
    }
  }
  uVar9 = local_28._24_8_;
  paVar13 = &local_671;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_670,"baseline",paVar13);
  bVar10 = (**(code **)(*(long *)uVar9 + 8))(uVar9,local_670);
  local_872 = 0;
  if ((bVar10 & 1) != 0) {
    local_872 = local_4e1;
  }
  std::__cxx11::string::~string(local_670);
  std::allocator<char>::~allocator((allocator<char> *)&local_671);
  if ((local_872 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_698,"check_enabled",&local_699);
    in_stack_fffffffffffff770 = &local_6c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6c0,"",in_stack_fffffffffffff770);
    (**(code **)(*(long *)local_28._24_8_ + 0x28))(local_28._24_8_,local_698,local_6c0);
    std::__cxx11::string::~string(local_6c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
    std::__cxx11::string::~string(local_698);
    std::allocator<char>::~allocator((allocator<char> *)&local_699);
  }
  base_00 = setup_base((options_i *)in_stack_fffffffffffff758,in_stack_fffffffffffff750);
  in_stack_fffffffffffff760 = LEARNER::as_multiline<char,char>((learner<char,_char> *)l_00);
  ppVar1 = *(parser **)(local_28._16_8_ + 8);
  (ppVar1->lp).label_size = DAT_0048cd28;
  puVar8 = PTR_test_label_0048cd20;
  puVar7 = PTR_weight_0048cd10;
  puVar6 = PTR_delete_label_0048cd08;
  puVar5 = PTR_read_cached_label_0048cd00;
  puVar4 = PTR_cache_label_0048ccf8;
  puVar3 = PTR_parse_label_0048ccf0;
  puVar2 = CB::cb_label;
  (ppVar1->lp).copy_label = (_func_void_void_ptr_void_ptr *)PTR_copy_label_0048cd18;
  (ppVar1->lp).test_label = (_func_bool_void_ptr *)puVar8;
  (ppVar1->lp).delete_label = (_func_void_void_ptr *)puVar6;
  (ppVar1->lp).get_weight = (_func_float_void_ptr *)puVar7;
  (ppVar1->lp).cache_label = (_func_void_void_ptr_io_buf_ptr *)puVar4;
  (ppVar1->lp).read_cached_label = (_func_size_t_shared_data_ptr_void_ptr_io_buf_ptr *)puVar5;
  (ppVar1->lp).default_label = (_func_void_void_ptr *)puVar2;
  (ppVar1->lp).parse_label =
       (_func_void_parser_ptr_shared_data_ptr_void_ptr_v_array<substring>_ptr *)puVar3;
  *(label_type_t *)(local_28._16_8_ + 0x3650) = cb;
  in_stack_fffffffffffff750 = (vw *)local_28;
  pcVar12 = std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::get
                      ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)in_stack_fffffffffffff750);
  this_00 = LEARNER::
            init_learner<CB_ADF::cb_adf,std::vector<example*,std::allocator<example*>>,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                      ((free_ptr<CB_ADF::cb_adf> *)in_stack_fffffffffffff770,
                       (learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *)base_00
                       ,(_func_void_cb_adf_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                         *)in_stack_fffffffffffff760,
                       (_func_void_cb_adf_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                        *)in_stack_fffffffffffff758,(size_t)in_stack_fffffffffffff750,pred_type);
  LEARNER::learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_>::
  set_finish_example(this_00,CB_ADF::finish_multiline_example);
  (pcVar12->gen_cs).scorer = *(single_learner **)(local_28._16_8_ + 0x30);
  LEARNER::learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_>::set_finish
            ((learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_> *)
             in_stack_fffffffffffff770,(_func_void_cb_adf_ptr *)base_00);
  LEARNER::learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_>::
  set_save_load(this_00,CB_ADF::save_load);
  local_8 = (AllReduce *)
            LEARNER::make_base<CB_ADF::cb_adf,std::vector<example*,std::allocator<example*>>>
                      (this_00);
LAB_003a88f4:
  local_488 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff750);
  std::__cxx11::string::~string(local_50);
  std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)in_stack_fffffffffffff760);
  return (base_learner *)local_8;
}

Assistant:

base_learner* cb_adf_setup(options_i& options, vw& all)
{
  auto ld = scoped_calloc_or_throw<cb_adf>();
  bool cb_adf_option = false;
  std::string type_string = "mtr";

  option_group_definition new_options("Contextual Bandit with Action Dependent Features");
  new_options
      .add(make_option("cb_adf", cb_adf_option)
               .keep()
               .help("Do Contextual Bandit learning with multiline action dependent features."))
      .add(make_option("rank_all", ld->rank_all).keep().help("Return actions sorted by score order"))
      .add(make_option("no_predict", ld->no_predict).help("Do not do a prediction when training"))
      .add(make_option("cb_type", type_string).keep().help("contextual bandit method to use in {ips, dm, dr, mtr, sm}. Default: mtr"));
  options.add_and_parse(new_options);

  if (!cb_adf_option)
    return nullptr;

  // Ensure serialization of this option in all cases.
  if (!options.was_supplied("cb_type"))
  {
    options.insert("cb_type", type_string);
    options.add_and_parse(new_options);
  }

  ld->all = &all;

  // number of weight vectors needed
  size_t problem_multiplier = 1;  // default for IPS
  bool check_baseline_enabled = false;

  if (type_string.compare("dr") == 0)
  {
    ld->gen_cs.cb_type = CB_TYPE_DR;
    problem_multiplier = 2;
    // only use baseline when manually enabled for loss estimation
    check_baseline_enabled = true;
  }
  else if (type_string.compare("ips") == 0)
    ld->gen_cs.cb_type = CB_TYPE_IPS;
  else if (type_string.compare("mtr") == 0)
    ld->gen_cs.cb_type = CB_TYPE_MTR;
  else if (type_string.compare("dm") == 0)
    ld->gen_cs.cb_type = CB_TYPE_DM;
  else if (type_string.compare("sm") == 0)
    ld->gen_cs.cb_type = CB_TYPE_SM;
  else
  {
    all.trace_message << "warning: cb_type must be in {'ips','dr','mtr','dm','sm'}; resetting to mtr." << std::endl;
    ld->gen_cs.cb_type = CB_TYPE_MTR;
  }

  all.delete_prediction = ACTION_SCORE::delete_action_scores;

  // Push necessary flags.
  if ((!options.was_supplied("csoaa_ldf") && !options.was_supplied("wap_ldf")) || ld->rank_all ||
      !options.was_supplied("csoaa_rank"))
  {
    if (!options.was_supplied("csoaa_ldf"))
    {
      options.insert("csoaa_ldf", "multiline");
    }

    if (!options.was_supplied("csoaa_rank"))
    {
      options.insert("csoaa_rank", "");
    }
  }

  if (options.was_supplied("baseline") && check_baseline_enabled)
  {
    options.insert("check_enabled", "");
  }

  auto base = as_multiline(setup_base(options, all));
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  cb_adf* bare = ld.get();
  learner<cb_adf, multi_ex>& l = init_learner(ld, base, CB_ADF::do_actual_learning<true>,
      CB_ADF::do_actual_learning<false>, problem_multiplier, prediction_type::action_scores);
  l.set_finish_example(CB_ADF::finish_multiline_example);

  bare->gen_cs.scorer = all.scorer;

  l.set_finish(CB_ADF::finish);
  l.set_save_load(CB_ADF::save_load);
  return make_base(l);
}